

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O1

void __thiscall
helics::helicsCLI11App::helicsCLI11App
          (helicsCLI11App *this,string *app_description,string *app_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  _Invoker_type p_Var5;
  undefined8 uVar6;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  Option *pOVar7;
  App *this_00;
  _Any_data __tmp;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  long *local_150;
  long local_148;
  long local_140 [2];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_170._M_dataplus._M_p = (app_description->_M_dataplus)._M_p;
  paVar1 = &app_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == paVar1) {
    local_170.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_170.field_2._8_8_ = *(undefined8 *)((long)&app_description->field_2 + 8);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_170._M_string_length = app_description->_M_string_length;
  (app_description->_M_dataplus)._M_p = (pointer)paVar1;
  app_description->_M_string_length = 0;
  (app_description->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (app_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + app_name->_M_string_length);
  CLI::App::App(&this->super_App,&local_170,&local_50,(App *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  (this->super_App)._vptr_App = (_func_int **)&PTR__helicsCLI11App_004d8a18;
  this->quiet = false;
  this->passConfig = true;
  *(undefined8 *)&this->last_output = 0;
  *(undefined8 *)
   ((long)&(this->cbacks).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cbacks).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->cbacks).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->remArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->remArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->remArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"-h,-?,--help","");
  paVar1 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Print this help message and exit","");
  pOVar7 = (this->super_App).help_ptr_;
  if (pOVar7 != (Option *)0x0) {
    CLI::App::remove_option(&this->super_App,pOVar7);
    (this->super_App).help_ptr_ = (Option *)0x0;
  }
  if (local_148 != 0) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_150,local_148 + (long)local_150);
    pOVar7 = CLI::App::
             add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (&this->super_App,&local_1b8,&local_190);
    (this->super_App).help_ptr_ = pOVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    (((this->super_App).help_ptr_)->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--config-file,--config","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"helics_config.toml","");
  paVar2 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"specify base configuration file","");
  CLI::App::set_config(&this->super_App,&local_70,&local_90,&local_1b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"--version","");
  local_1b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"3.6.1 (2025-02-24)","");
  local_190._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Display program version information and exit","");
  CLI::App::set_version_flag(&this->super_App,&local_b0,&local_1b8,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"quiet","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  this_00 = &CLI::App::add_option_group<CLI::Option_group>(&this->super_App,&local_d0,&local_f0)->
             super_App;
  this_00->immediate_callback_ = true;
  p_Var4 = (this_00->final_callback_).super__Function_base._M_manager;
  if ((p_Var4 != (_Manager_type)0x0) &&
     ((this_00->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_1b8._M_dataplus._M_p =
         *(pointer *)&(this_00->final_callback_).super__Function_base._M_functor;
    local_1b8._M_string_length =
         *(size_type *)((long)&(this_00->final_callback_).super__Function_base._M_functor + 8);
    uVar6 = *(undefined8 *)
             ((long)&(this_00->parse_complete_callback_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this_00->final_callback_).super__Function_base._M_functor =
         *(undefined8 *)&(this_00->parse_complete_callback_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this_00->final_callback_).super__Function_base._M_functor + 8) = uVar6;
    *(pointer *)&(this_00->parse_complete_callback_).super__Function_base._M_functor =
         local_1b8._M_dataplus._M_p;
    *(size_type *)((long)&(this_00->parse_complete_callback_).super__Function_base._M_functor + 8) =
         local_1b8._M_string_length;
    (this_00->final_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this_00->parse_complete_callback_).super__Function_base._M_manager = p_Var4;
    p_Var5 = (this_00->final_callback_)._M_invoker;
    (this_00->final_callback_)._M_invoker = (this_00->parse_complete_callback_)._M_invoker;
    (this_00->parse_complete_callback_)._M_invoker = p_Var5;
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--quiet","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"silence most print output","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(this_00,&local_110,&this->quiet,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit helicsCLI11App(std::string app_description = "", const std::string& app_name = ""):
        CLI::App(std::move(app_description), app_name, nullptr)
    {
        set_help_flag("-h,-?,--help", "Print this help message and exit");
        set_config("--config-file,--config",
                   "helics_config.toml",
                   "specify base configuration file");
        set_version_flag("--version", helics::versionString);
        add_option_group("quiet")->immediate_callback()->add_flag("--quiet",
                                                                  quiet,
                                                                  "silence most print output");
    }